

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

String * __thiscall
capnp::JsonCodec::encode<capnp::Text::Reader>
          (String *__return_storage_ptr__,JsonCodec *this,Reader *value)

{
  Reader *pRVar1;
  Reader local_88;
  Reader local_78;
  undefined1 auStack_30 [8];
  Type type;
  Reader *value_local;
  JsonCodec *this_local;
  
  type.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)value;
  _auStack_30 = capnp::Type::from<capnp::Text::Reader&>(value);
  pRVar1 = kj::fwd<capnp::Text::Reader>((NoInfer<capnp::Text::Reader> *)type.field_4.schema);
  local_88.super_StringPtr.content.ptr = (pRVar1->super_StringPtr).content.ptr;
  local_88.super_StringPtr.content.size_ = (pRVar1->super_StringPtr).content.size_;
  DynamicValue::Reader::Reader(&local_78,&local_88);
  encode(__return_storage_ptr__,this,&local_78,_auStack_30);
  DynamicValue::Reader::~Reader(&local_78);
  return __return_storage_ptr__;
}

Assistant:

kj::String JsonCodec::encode(T&& value) const {
  Type type = Type::from(value);
  typedef FromAny<kj::Decay<T>> Base;
  return encode(DynamicValue::Reader(ReaderFor<Base>(kj::fwd<T>(value))), type);
}